

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::doAnalysis::Mapper::~Mapper(Mapper *this)

{
  void *pvVar1;
  
  *(undefined ***)this = &PTR__Mapper_01071290;
  if (*(code **)(this + 0x150) != (code *)0x0) {
    (**(code **)(this + 0x150))(this + 0x140,this + 0x140,3);
  }
  pvVar1 = *(void **)(this + 0x108);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0x118) - (long)pvVar1);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x160);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }